

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.hh
# Opt level: O2

expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
tinyusdz::Xformable::GetLocalMatrix_abi_cxx11_
          (expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Xformable *this,double t,TimeSampleInterpolationType tinterp,
          bool *resetTransformStack)

{
  bool bVar1;
  long lVar2;
  matrix4d *pmVar3;
  expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *peVar4;
  matrix4d *pmVar5;
  byte bVar6;
  string err;
  string local_b0 [32];
  matrix4d m;
  
  bVar6 = 0;
  if ((NAN(t)) && (this->_dirty == false)) {
LAB_0020b8c5:
    (__return_storage_ptr__->contained).
    super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = true;
    pmVar3 = &this->_matrix;
    peVar4 = __return_storage_ptr__;
    for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
      (peVar4->contained).
      super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_value.m[0][0] = pmVar3->m[0][0];
      pmVar3 = (matrix4d *)((long)pmVar3 + (ulong)bVar6 * -0x10 + 8);
      peVar4 = (expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)((long)peVar4 + (ulong)bVar6 * -0x10 + 8);
    }
  }
  else {
    m.m[0][0] = 1.0;
    m.m[0][1] = 0.0;
    m.m[0][2] = 0.0;
    m.m[0][3] = 0.0;
    m.m[1][0] = 0.0;
    m.m[1][1] = 1.0;
    m.m[1][2] = 0.0;
    m.m[1][3] = 0.0;
    m.m[2][0] = 0.0;
    m.m[2][1] = 0.0;
    m.m[2][2] = 1.0;
    m.m[2][3] = 0.0;
    m.m[3][0] = 0.0;
    m.m[3][1] = 0.0;
    m.m[3][2] = 0.0;
    m.m[3][3] = 1.0;
    err._M_dataplus._M_p = (pointer)&err.field_2;
    err._M_string_length = 0;
    err.field_2._M_local_buf[0] = '\0';
    bVar1 = EvaluateXformOps(this,t,tinterp,&m,resetTransformStack,&err);
    if (bVar1) {
      if (NAN(t)) {
        pmVar3 = &m;
        pmVar5 = &this->_matrix;
        for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
          pmVar5->m[0][0] = pmVar3->m[0][0];
          pmVar3 = (matrix4d *)((long)pmVar3 + ((ulong)bVar6 * -2 + 1) * 8);
          pmVar5 = (matrix4d *)((long)pmVar5 + (ulong)bVar6 * -0x10 + 8);
        }
        this->_dirty = false;
        ::std::__cxx11::string::_M_dispose();
        goto LAB_0020b8c5;
      }
      (__return_storage_ptr__->contained).
      super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value = true;
      pmVar3 = &m;
      peVar4 = __return_storage_ptr__;
      for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
        (peVar4->contained).
        super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0.m_value.m[0][0] = pmVar3->m[0][0];
        pmVar3 = (matrix4d *)((long)pmVar3 + ((ulong)bVar6 * -2 + 1) * 8);
        peVar4 = (expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)peVar4 + (ulong)bVar6 * -0x10 + 8);
      }
    }
    else {
      ::std::__cxx11::string::string(local_b0,(string *)&err);
      nonstd::expected_lite::
      expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (__return_storage_ptr__,
                 (unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_b0);
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::string::_M_dispose();
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<value::matrix4d, std::string> GetLocalMatrix(double t = value::TimeCode::Default(), value::TimeSampleInterpolationType tinterp = value::TimeSampleInterpolationType::Linear, bool *resetTransformStack = nullptr) const {
    if (_dirty || !value::TimeCode(t).is_default()) {
      value::matrix4d m;
      std::string err;
      if (EvaluateXformOps(t, tinterp, &m, resetTransformStack, &err)) {
        if (value::TimeCode(t).is_default()) {
          _matrix = m;
          _dirty = false;
        }
        else {
          return m;
        }
      } else {
        return nonstd::make_unexpected(err);
      }
    }

    return _matrix;
  }